

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_http.hpp
# Opt level: O0

void __thiscall
SimpleWeb::
ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::
Session::Session(Session *this,size_t max_response_streambuf_size,
                shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
                *connection_,
                unique_ptr<asio::basic_streambuf<std::allocator<char>_>,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
                *request_streambuf_)

{
  Response *this_00;
  unique_ptr<asio::basic_streambuf<std::allocator<char>_>,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
  *request_streambuf__local;
  shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
  *connection__local;
  size_t max_response_streambuf_size_local;
  Session *this_local;
  
  std::
  shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
  ::shared_ptr(&this->connection,connection_);
  std::
  unique_ptr<asio::basic_streambuf<std::allocator<char>_>,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
  ::unique_ptr(&this->request_streambuf,request_streambuf_);
  this_00 = (Response *)operator_new(0x1c0);
  Response::Response(this_00,max_response_streambuf_size,&this->connection);
  std::
  shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Response>
  ::
  shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Response,void>
            ((shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Response>
              *)&this->response,this_00);
  std::function<void_(const_std::error_code_&)>::function(&this->callback);
  return;
}

Assistant:

Session(std::size_t max_response_streambuf_size, std::shared_ptr<Connection> connection_, std::unique_ptr<asio::streambuf> request_streambuf_) noexcept
          : connection(std::move(connection_)), request_streambuf(std::move(request_streambuf_)), response(new Response(max_response_streambuf_size, connection)) {}